

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorLeave
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *feastol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  pointer pIVar4;
  IdxElement *keys;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  undefined4 *puVar9;
  pointer pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  devexpr *pdVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  uint *puVar15;
  long lVar16;
  byte bVar17;
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [13];
  undefined3 uStack_2cb;
  int iStack_2c8;
  bool bStack_2c4;
  undefined8 local_2c0;
  undefined1 local_2b4 [20];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [13];
  undefined3 uStack_243;
  int iStack_240;
  bool bStack_23c;
  undefined8 local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar17 = 0;
  local_2c0._0_4_ = cpp_dec_float_finite;
  local_2c0._4_4_ = 0x1c;
  local_338._0_16_ = (undefined1  [16])0x0;
  local_338._16_16_ = (undefined1  [16])0x0;
  local_318 = (undefined1  [16])0x0;
  local_308 = (undefined1  [16])0x0;
  local_2f8 = (undefined1  [16])0x0;
  local_2e8 = (undefined1  [16])0x0;
  local_2d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_2cb = 0;
  iStack_2c8 = 0;
  bStack_2c4 = false;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_238._0_4_ = cpp_dec_float_finite;
  local_238._4_4_ = 0x1c;
  local_2b4._4_16_ = (undefined1  [16])0x0;
  local_2a0 = (undefined1  [16])0x0;
  local_290 = (undefined1  [16])0x0;
  local_280 = (undefined1  [16])0x0;
  local_270 = (undefined1  [16])0x0;
  local_260 = (undefined1  [16])0x0;
  local_250 = SUB1613((undefined1  [16])0x0,0);
  uStack_243 = 0;
  iStack_240 = 0;
  bStack_23c = false;
  pIVar4 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar4) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar4;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  lVar16 = (long)(pSVar1->infeasibilities).super_IdxSet.num;
  if (0 < lVar16) {
    lVar16 = lVar16 + 1;
    do {
      iVar7 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->infeasibilities).super_IdxSet.idx[lVar16 + -2];
      pnVar10 = pnVar2 + iVar7;
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)local_338;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
      }
      iStack_2c8 = pnVar2[iVar7].m_backend.exp;
      bStack_2c4 = pnVar2[iVar7].m_backend.neg;
      local_2c0._0_4_ = pnVar2[iVar7].m_backend.fpclass;
      local_2c0._4_4_ = pnVar2[iVar7].m_backend.prec_elem;
      pnVar11 = feastol;
      pcVar12 = &result.m_backend;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
      }
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      if (result.m_backend.data._M_elems[0] != 0 || result.m_backend.fpclass != cpp_dec_float_finite
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      if (result.m_backend.fpclass != cpp_dec_float_NaN &&
          (fpclass_type)local_2c0 != cpp_dec_float_NaN) {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_338,&result.m_backend);
        if (iVar5 < 0) {
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->isInfeasible).data[iVar7] = 1;
          local_2b4._0_4_ = iVar7;
          puVar9 = (undefined4 *)local_338;
          pdVar13 = local_b0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *(undefined4 *)pdVar13 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
            pdVar13 = pdVar13 + (ulong)bVar17 * -8 + 4;
          }
          local_40 = iStack_2c8;
          local_3c = bStack_2c4;
          local_38 = (fpclass_type)local_2c0;
          iStack_34 = local_2c0._4_4_;
          pnVar10 = pnVar3 + iVar7;
          pnVar11 = &local_130;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pnVar11->m_backend).data._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
            pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar17 * -2 + 1) * 4);
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
          }
          local_130.m_backend.exp = pnVar3[iVar7].m_backend.exp;
          local_130.m_backend.neg = pnVar3[iVar7].m_backend.neg;
          local_130.m_backend.fpclass = pnVar3[iVar7].m_backend.fpclass;
          local_130.m_backend.prec_elem = pnVar3[iVar7].m_backend.prec_elem;
          pnVar11 = feastol;
          pnVar14 = &local_1b0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar17 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = (feastol->m_backend).exp;
          local_1b0.m_backend.neg = (feastol->m_backend).neg;
          local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
          local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
          devexpr::
          computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&result,local_b0,&local_130,&local_1b0,&local_130);
          pnVar11 = &result;
          puVar15 = (uint *)(local_2b4 + 4);
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar15 = (pnVar11->m_backend).data._M_elems[0];
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar17 * -2 + 1) * 4);
            puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
          }
          iStack_240 = result.m_backend.exp;
          bStack_23c = result.m_backend.neg;
          local_238._0_4_ = result.m_backend.fpclass;
          local_238._4_4_ = result.m_backend.prec_elem;
          std::
          vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
          ::push_back(&(this->prices).data,(value_type *)local_2b4);
        }
      }
      lVar16 = lVar16 + -1;
    } while (1 < lVar16);
  }
  keys = (this->prices).data.
         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar4 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  uVar6 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (keys,&(this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).compare,0,(int)((ulong)((long)pIVar4 - (long)keys) >> 2) * 0x3e0f83e1,
                     100,0,0,true);
  if (0 < (int)uVar6) {
    lVar16 = 0;
    do {
      DIdxSet::addIdx(&this->bestPrices,
                      *(int *)((long)&(((this->prices).data.
                                        super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                              lVar16 + -4));
      (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->isInfeasible).data
      [*(int *)((long)&(((this->prices).data.
                         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                         ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar16 + -4)]
           = 2;
      lVar16 = lVar16 + 0x84;
    } while ((ulong)uVar6 * 0x84 != lVar16);
  }
  if ((int)uVar6 < 1) {
    iVar7 = -1;
  }
  else {
    iVar7 = ((this->prices).data.
             super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start)->idx;
  }
  return iVar7;
}

Assistant:

int SPxDevexPR<R>::buildBestPriceVectorLeave(R feastol)
{
   int idx;
   int nsorted;
   R fTesti;
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // TODO we should check infeasiblities for duplicates or loop over dimension
   //      bestPrices may then also contain duplicates!
   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      fTesti = fTest[idx];

      if(fTesti < -feastol)
      {
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(fTesti, cpen[idx], feastol);
         prices.append(price);
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
      return prices[0].idx;
   else
      return -1;
}